

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  undefined4 uVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t zero;
  undefined1 local_19;
  
  pvVar6 = lj_mem_realloc(L,*ud,*(MSize *)((long)ud + 0xc),0x400);
  *(void **)ud = pvVar6;
  *(undefined4 *)((long)ud + 0xc) = 0x400;
  uVar10 = (ulong)*(uint *)(*(long *)((long)ud + 0x18) + 0x28);
  uVar2 = *(uint *)(uVar10 + 0xc);
  *(undefined4 *)((long)ud + 8) = 0;
  if (0x400 < uVar2 + 10) {
    bcwrite_resize((BCWriteCtx *)ud,uVar2 + 10);
  }
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 0x1b;
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 0x4c;
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 0x4a;
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 1;
  bVar1 = *(byte *)(*(long *)((long)ud + 0x18) + 0x25);
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(byte *)(*ud + (ulong)uVar4) = bVar1 & 4 | (*(int *)((long)ud + 0x30) != 0) * '\x02';
  if (*(int *)((long)ud + 0x30) == 0) {
    uVar4 = *(uint *)((long)ud + 8);
    lVar3 = *ud;
    uVar7 = (ulong)uVar2;
    if (uVar2 < 0x80) {
      uVar7 = (ulong)uVar2;
    }
    else {
      do {
        uVar8 = (uint)uVar7;
        uVar9 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        *(byte *)(lVar3 + uVar9) = (byte)uVar7 | 0x80;
        uVar7 = uVar7 >> 7;
      } while (0x3fff < uVar8);
    }
    *(char *)(lVar3 + (ulong)uVar4) = (char)uVar7;
    lVar3 = *ud;
    *(uint *)((long)ud + 8) = uVar4 + uVar2 + 1;
    if (uVar2 != 0) {
      uVar7 = 0;
      do {
        *(undefined1 *)((ulong)(uVar4 + 1) + lVar3 + uVar7) = *(undefined1 *)(uVar10 + 0x10 + uVar7)
        ;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
  }
  uVar5 = (**(code **)((long)ud + 0x20))
                    (*(undefined8 *)((long)ud + 0x10),*ud,*(undefined4 *)((long)ud + 8),
                     *(undefined8 *)((long)ud + 0x28));
  *(undefined4 *)((long)ud + 0x34) = uVar5;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x18));
  if (*(int *)((long)ud + 0x34) == 0) {
    local_19 = 0;
    uVar5 = (**(code **)((long)ud + 0x20))
                      (*(undefined8 *)((long)ud + 0x10),&local_19,1,*(undefined8 *)((long)ud + 0x28)
                      );
    *(undefined4 *)((long)ud + 0x34) = uVar5;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(dummy);
  lj_str_resizebuf(L, &ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}